

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O0

void __kmp_dispatch_deo<unsigned_long_long>(int *gtid_ref,int *cid_ref,ident_t *loc_ref)

{
  _func_kmp_uint32_unsigned_long_long_unsigned_long_long *in_RDX;
  unsigned_long_long in_RSI;
  unsigned_long_long *in_RDI;
  unsigned_long_long lower;
  dispatch_shared_info_template<unsigned_long_long> *sh;
  kmp_info_t *th;
  int gtid;
  dispatch_private_info_template<unsigned_long_long> *pr;
  undefined8 in_stack_ffffffffffffffc8;
  kmp_info_t *lck;
  undefined4 in_stack_ffffffffffffffd8;
  dispatch_private_info_t *in_stack_ffffffffffffffe0;
  
  lck = __kmp_threads[(int)*in_RDI];
  if ((__kmp_env_consistency_check != 0) &&
     (in_stack_ffffffffffffffe0 = ((lck->th).th_dispatch)->th_dispatch_pr_current,
     in_stack_ffffffffffffffe0->pushed_ws != ct_none)) {
    __kmp_push_sync((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                    (cons_type)in_stack_ffffffffffffffe0,
                    (ident_t *)CONCAT44((int)*in_RDI,in_stack_ffffffffffffffd8),(kmp_user_lock_p)lck
                    ,(kmp_uint32)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  }
  if ((((lck->th).th_team)->t).t_serialized == 0) {
    if (__kmp_env_consistency_check == 0) {
      in_stack_ffffffffffffffe0 = ((lck->th).th_dispatch)->th_dispatch_pr_current;
    }
    __kmp_wait_yield<unsigned_long_long>(in_RDI,in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

static void
__kmp_dispatch_deo( int *gtid_ref, int *cid_ref, ident_t *loc_ref )
{
    typedef typename traits_t< UT >::signed_t    ST;
    dispatch_private_info_template< UT > * pr;

    int gtid = *gtid_ref;
//    int  cid = *cid_ref;
    kmp_info_t *th = __kmp_threads[ gtid ];
    KMP_DEBUG_ASSERT( th -> th.th_dispatch );

    KD_TRACE(100, ("__kmp_dispatch_deo: T#%d called\n", gtid ) );
    if ( __kmp_env_consistency_check ) {
        pr = reinterpret_cast< dispatch_private_info_template< UT >* >
            ( th -> th.th_dispatch -> th_dispatch_pr_current );
        if ( pr -> pushed_ws != ct_none ) {
#if KMP_USE_DYNAMIC_LOCK
            __kmp_push_sync( gtid, ct_ordered_in_pdo, loc_ref, NULL, 0 );
#else
            __kmp_push_sync( gtid, ct_ordered_in_pdo, loc_ref, NULL );
#endif
        }
    }

    if ( ! th -> th.th_team -> t.t_serialized ) {
        dispatch_shared_info_template< UT >  * sh = reinterpret_cast< dispatch_shared_info_template< UT >* >
            ( th -> th.th_dispatch -> th_dispatch_sh_current );
        UT  lower;

        if ( ! __kmp_env_consistency_check ) {
                pr = reinterpret_cast< dispatch_private_info_template< UT >* >
                    ( th -> th.th_dispatch -> th_dispatch_pr_current );
        }
        lower = pr->u.p.ordered_lower;

        #if ! defined( KMP_GOMP_COMPAT )
            if ( __kmp_env_consistency_check ) {
                if ( pr->ordered_bumped ) {
                    struct cons_header *p = __kmp_threads[ gtid ]->th.th_cons;
                    __kmp_error_construct2(
                        kmp_i18n_msg_CnsMultipleNesting,
                        ct_ordered_in_pdo, loc_ref,
                        & p->stack_data[ p->w_top ]
                    );
                }
            }
        #endif /* !defined(KMP_GOMP_COMPAT) */

        KMP_MB();
        #ifdef KMP_DEBUG
        {
            const char * buff;
            // create format specifiers before the debug output
            buff = __kmp_str_format(
                "__kmp_dispatch_deo: T#%%d before wait: ordered_iter:%%%s lower:%%%s\n",
                traits_t< UT >::spec, traits_t< UT >::spec );
            KD_TRACE(1000, ( buff, gtid, sh->u.s.ordered_iteration, lower ) );
            __kmp_str_free( &buff );
        }
        #endif

        __kmp_wait_yield< UT >( &sh->u.s.ordered_iteration, lower, __kmp_ge< UT >
                                USE_ITT_BUILD_ARG( NULL )
                                );
        KMP_MB();  /* is this necessary? */
        #ifdef KMP_DEBUG
        {
            const char * buff;
            // create format specifiers before the debug output
            buff = __kmp_str_format(
                "__kmp_dispatch_deo: T#%%d after wait: ordered_iter:%%%s lower:%%%s\n",
                traits_t< UT >::spec, traits_t< UT >::spec );
            KD_TRACE(1000, ( buff, gtid, sh->u.s.ordered_iteration, lower ) );
            __kmp_str_free( &buff );
        }
        #endif
    }
    KD_TRACE(100, ("__kmp_dispatch_deo: T#%d returned\n", gtid ) );
}